

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O3

int parse_connection_string
              (IOTHUB_PROVISIONED_DEVICE *device_info,IOTHUB_CLIENT_CONFIG *client_config)

{
  IOTHUB_PROVISIONED_DEVICE *pIVar1;
  char cVar2;
  char *pcVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  long lVar6;
  IOTHUB_PROVISIONED_DEVICE *__src;
  undefined1 *puVar7;
  size_t sVar8;
  IOTHUB_PROVISIONED_DEVICE *__src_00;
  ulong uVar9;
  undefined1 auVar10 [16];
  
  iVar5 = 0;
  if ((device_info != (IOTHUB_PROVISIONED_DEVICE *)0x0) &&
     (iVar5 = 0, *(char *)&device_info->connectionString != '\0')) {
    uVar9 = 0;
    do {
      if (*(char *)&device_info->primaryAuthentication == '=' &&
          device_info->connectionString == (char *)0x656d614e74736f48) {
        __src = (IOTHUB_PROVISIONED_DEVICE *)((long)&device_info->primaryAuthentication + 1);
        cVar2 = *(char *)((long)&device_info->primaryAuthentication + 1);
        iVar5 = 0;
        if (cVar2 != '\0') {
          puVar7 = (undefined1 *)((long)&device_info->primaryAuthentication + 1);
          lVar6 = 0;
          pIVar1 = (IOTHUB_PROVISIONED_DEVICE *)((long)&device_info->primaryAuthentication + 2);
          __src_00 = __src;
          do {
            __src = pIVar1;
            if (cVar2 == '.') {
              if (client_config->iotHubName == (char *)0x0) {
                pcVar3 = (char *)calloc(1,lVar6 + 1);
                client_config->iotHubName = pcVar3;
                if (pcVar3 == (char *)0x0) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                              ,"parse_connection_string",0xd6,1,"Failure allocating iothub Name");
                  }
                  cleanup_config_object(client_config);
                  iVar5 = 0xd7;
                  break;
                }
                memcpy(pcVar3,__src_00,(long)puVar7 - (long)__src_00);
                lVar6 = 0;
                __src_00 = __src;
              }
            }
            else if (cVar2 == ';') {
              pcVar3 = (char *)calloc(1,lVar6 + 1);
              client_config->iotHubSuffix = pcVar3;
              __src = (IOTHUB_PROVISIONED_DEVICE *)&__src[-1].field_0x37;
              if (pcVar3 == (char *)0x0) {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                            ,"parse_connection_string",0xe9,1,"Failure allocating iothub suffix");
                }
                cleanup_config_object(client_config);
                iVar5 = 0xea;
              }
              else {
                memcpy(pcVar3,__src_00,(long)puVar7 - (long)__src_00);
                iVar5 = 0;
              }
              break;
            }
            lVar6 = lVar6 + 1;
            cVar2 = *(char *)&__src->connectionString;
            puVar7 = puVar7 + 1;
            pIVar1 = (IOTHUB_PROVISIONED_DEVICE *)((long)&__src->connectionString + 1);
          } while (cVar2 != '\0');
        }
        uVar9 = uVar9 + 1;
      }
      else {
        if (*(char *)&device_info->primaryAuthentication == '=' &&
            device_info->connectionString == (char *)0x6449656369766544) {
          __src = (IOTHUB_PROVISIONED_DEVICE *)((long)&device_info->primaryAuthentication + 1);
          if (client_config->deviceId == (char *)0x0) {
            for (sVar8 = 0;
                (cVar2 = *(char *)((long)&__src->connectionString + sVar8), cVar2 != '\0' &&
                (cVar2 != ';')); sVar8 = sVar8 + 1) {
            }
            pcVar3 = (char *)calloc(1,sVar8 + 1);
            client_config->deviceId = pcVar3;
            pIVar1 = (IOTHUB_PROVISIONED_DEVICE *)((long)&__src->connectionString + sVar8);
            if (pcVar3 == (char *)0x0) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                          ,"parse_connection_string",0x10a,1,"Failure allocating iothub device id");
              }
              cleanup_config_object(client_config);
              iVar5 = 0x10b;
              __src = pIVar1;
            }
            else {
              memcpy(pcVar3,__src,sVar8);
              iVar5 = 0;
              __src = pIVar1;
            }
          }
          else {
            p_Var4 = xlogging_get_log_function();
            iVar5 = 0x117;
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                        ,"parse_connection_string",0x116,1,
                        "invalid value state.  device previously allocated");
            }
          }
        }
        else {
          auVar10[0] = -(*(char *)&device_info->connectionString == 'S');
          auVar10[1] = -(*(char *)((long)&device_info->connectionString + 1) == 'h');
          auVar10[2] = -(*(char *)((long)&device_info->connectionString + 2) == 'a');
          auVar10[3] = -(*(char *)((long)&device_info->connectionString + 3) == 'r');
          auVar10[4] = -(*(char *)((long)&device_info->connectionString + 4) == 'e');
          auVar10[5] = -(*(char *)((long)&device_info->connectionString + 5) == 'd');
          auVar10[6] = -(*(char *)((long)&device_info->connectionString + 6) == 'A');
          auVar10[7] = -(*(char *)((long)&device_info->connectionString + 7) == 'c');
          auVar10[8] = -(*(char *)&device_info->primaryAuthentication == 'c');
          auVar10[9] = -(*(char *)((long)&device_info->primaryAuthentication + 1) == 'e');
          auVar10[10] = -(*(char *)((long)&device_info->primaryAuthentication + 2) == 's');
          auVar10[0xb] = -(*(char *)((long)&device_info->primaryAuthentication + 3) == 's');
          auVar10[0xc] = -(*(char *)((long)&device_info->primaryAuthentication + 4) == 'K');
          auVar10[0xd] = -(*(char *)((long)&device_info->primaryAuthentication + 5) == 'e');
          auVar10[0xe] = -(*(char *)((long)&device_info->primaryAuthentication + 6) == 'y');
          auVar10[0xf] = -(*(char *)((long)&device_info->primaryAuthentication + 7) == '=');
          iVar5 = 0;
          __src = device_info;
          if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar10[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0011c431;
          __src = (IOTHUB_PROVISIONED_DEVICE *)&device_info->certificate;
          iVar5 = 0;
          if (client_config->deviceKey == (char *)0x0) {
            for (sVar8 = 0;
                (*(char *)((long)__src + sVar8) != '\0' && (*(char *)((long)__src + sVar8) != ';'));
                sVar8 = sVar8 + 1) {
            }
            pcVar3 = (char *)calloc(1,sVar8 + 1);
            client_config->deviceKey = pcVar3;
            if (pcVar3 == (char *)0x0) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                          ,"parse_connection_string",0x12a,1,"Failure allocating iothub device key")
                ;
              }
              cleanup_config_object(client_config);
              iVar5 = 299;
              __src = (IOTHUB_PROVISIONED_DEVICE *)((long)__src + sVar8);
            }
            else {
              memcpy(pcVar3,__src,sVar8);
              __src = (IOTHUB_PROVISIONED_DEVICE *)((long)__src + sVar8);
            }
          }
        }
        uVar9 = uVar9 + 1;
      }
LAB_0011c431:
    } while (((iVar5 == 0) && (*(char *)((long)&__src->connectionString + 1) != '\0')) &&
            (device_info = (IOTHUB_PROVISIONED_DEVICE *)((long)&__src->connectionString + 1),
            uVar9 < 3));
  }
  return iVar5;
}

Assistant:

static int parse_connection_string(const IOTHUB_PROVISIONED_DEVICE* device_info, IOTHUB_CLIENT_CONFIG* client_config)
{
    int result = 0;
    size_t tag_index = 0;
    size_t field_cnt = 0;
    size_t counter = 0;
    const char* initial_pos = NULL;
    const char* iterator = device_info->connectionString;
    while (iterator != NULL && *iterator != '\0' && result == 0 && field_cnt < 3)
    {
        if (memcmp(iterator, TEST_HOSTNAME_VALUE, TEST_HOSTNAME_VALUE_LEN) == 0)
        {
            counter = 0;
            iterator += TEST_HOSTNAME_VALUE_LEN;
            initial_pos = iterator;
            // Loop here and break up the hostname into it's parts
            while (*iterator != '\0' && result == 0)
            {
                if (*iterator == '.')
                {
                    if (client_config->iotHubName == NULL)
                    {
                        if ((client_config->iotHubName = (const char*)malloc(counter + 1)) == NULL)
                        {
                            LogError("Failure allocating iothub Name");
                            result = MU_FAILURE;
                            cleanup_config_object(client_config);
                        }
                        else
                        {
                            memset((char*)client_config->iotHubName, 0, counter + 1);
                            memcpy((char*)client_config->iotHubName, initial_pos, iterator - initial_pos);
                            // Change the initial position to the current pos beyond the .
                            initial_pos = iterator+1;
                            counter = 0;
                        }
                    }
                }
                else if (*iterator == ';')
                {
                    // Now get the suffix
                    if ((client_config->iotHubSuffix = (const char*)malloc(counter+1)) == NULL)
                    {
                        LogError("Failure allocating iothub suffix");
                        result = MU_FAILURE;
                        cleanup_config_object(client_config);
                    }
                    else
                    {
                        memset((char*)client_config->iotHubSuffix, 0, counter + 1);
                        memcpy((char*)client_config->iotHubSuffix, initial_pos, iterator - initial_pos);
                        initial_pos = iterator + 1;
                        counter = 0;
                    }
                    break;
                }
                iterator++;
                counter++;
            }
            field_cnt++;
        }
        else if (memcmp(iterator, TEST_DEVICEID_VALUE, TEST_DEVICEID_VALUE_LEN) == 0)
        {
            iterator += TEST_DEVICEID_VALUE_LEN;
            if (client_config->deviceId == NULL)
            {
                counter = 0;
                initial_pos = iterator;
                while (*iterator != '\0' && *iterator != ';')
                {
                    counter++;
                    iterator++;
                }

                if ((client_config->deviceId = (const char*)malloc(counter + 1)) == NULL)
                {
                    LogError("Failure allocating iothub device id");
                    result = MU_FAILURE;
                    cleanup_config_object(client_config);
                }
                else
                {
                    memset((char*)client_config->deviceId, 0, counter + 1);
                    memcpy((char*)client_config->deviceId, initial_pos, counter);
                }
            }
            else
            {
                LogError("invalid value state.  device previously allocated");
                result = MU_FAILURE;
            }
            field_cnt++;
        }
        else if (memcmp(iterator, TEST_SHARED_ACCESS_KEY_VALUE, TEST_SHARED_ACCESS_KEY_LEN) == 0)
        {
            iterator += TEST_SHARED_ACCESS_KEY_LEN;
            if (client_config->deviceKey == NULL)
            {
                counter = 0;
                initial_pos = iterator;
                while (*iterator != '\0' && *iterator != ';')
                {
                    counter++;
                    iterator++;
                }

                if ((client_config->deviceKey = (const char*)malloc(counter + 1)) == NULL)
                {
                    LogError("Failure allocating iothub device key");
                    result = MU_FAILURE;
                    cleanup_config_object(client_config);
                }
                else
                {
                    memset((char*)client_config->deviceKey, 0, counter + 1);
                    memcpy((char*)client_config->deviceKey, initial_pos, counter);
                }
            }
            field_cnt++;
        }
        iterator++;
    }
    return result;
}